

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlNodeDump(void)

{
  int iVar1;
  int iVar2;
  int val;
  int val_00;
  xmlBufferPtr val_01;
  xmlDocPtr val_02;
  xmlNodePtr val_03;
  int local_54;
  int n_format;
  int format;
  int n_level;
  int level;
  int n_cur;
  xmlNodePtr cur;
  int n_doc;
  xmlDocPtr doc;
  int n_buf;
  xmlBufferPtr buf;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (doc._4_4_ = 0; (int)doc._4_4_ < 3; doc._4_4_ = doc._4_4_ + 1) {
    for (cur._4_4_ = 0; (int)cur._4_4_ < 4; cur._4_4_ = cur._4_4_ + 1) {
      for (n_level = 0; n_level < 3; n_level = n_level + 1) {
        for (n_format = 0; n_format < 4; n_format = n_format + 1) {
          for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
            iVar1 = xmlMemBlocks();
            val_01 = gen_xmlBufferPtr(doc._4_4_,0);
            val_02 = gen_xmlDocPtr(cur._4_4_,1);
            val_03 = gen_xmlNodePtr(n_level,2);
            iVar2 = gen_int(n_format,3);
            val = gen_int(local_54,4);
            val_00 = xmlNodeDump(val_01,val_02,val_03,iVar2,val);
            desret_int(val_00);
            call_tests = call_tests + 1;
            des_xmlBufferPtr(doc._4_4_,val_01,0);
            des_xmlDocPtr(cur._4_4_,val_02,1);
            des_xmlNodePtr(n_level,val_03,2);
            des_int(n_format,iVar2,3);
            des_int(local_54,val,4);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlNodeDump",(ulong)(uint)(iVar2 - iVar1));
              ret_val = ret_val + 1;
              printf(" %d",(ulong)doc._4_4_);
              printf(" %d",(ulong)cur._4_4_);
              printf(" %d",(ulong)(uint)n_level);
              printf(" %d",(ulong)(uint)n_format);
              printf(" %d");
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlNodeDump(void) {
    int test_ret = 0;

#if defined(LIBXML_OUTPUT_ENABLED)
    int mem_base;
    int ret_val;
    xmlBufferPtr buf; /* the XML buffer output */
    int n_buf;
    xmlDocPtr doc; /* the document */
    int n_doc;
    xmlNodePtr cur; /* the current node */
    int n_cur;
    int level; /* the imbrication level for indenting */
    int n_level;
    int format; /* is formatting allowed */
    int n_format;

    for (n_buf = 0;n_buf < gen_nb_xmlBufferPtr;n_buf++) {
    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_cur = 0;n_cur < gen_nb_xmlNodePtr;n_cur++) {
    for (n_level = 0;n_level < gen_nb_int;n_level++) {
    for (n_format = 0;n_format < gen_nb_int;n_format++) {
        mem_base = xmlMemBlocks();
        buf = gen_xmlBufferPtr(n_buf, 0);
        doc = gen_xmlDocPtr(n_doc, 1);
        cur = gen_xmlNodePtr(n_cur, 2);
        level = gen_int(n_level, 3);
        format = gen_int(n_format, 4);

        ret_val = xmlNodeDump(buf, doc, cur, level, format);
        desret_int(ret_val);
        call_tests++;
        des_xmlBufferPtr(n_buf, buf, 0);
        des_xmlDocPtr(n_doc, doc, 1);
        des_xmlNodePtr(n_cur, cur, 2);
        des_int(n_level, level, 3);
        des_int(n_format, format, 4);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlNodeDump",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_buf);
            printf(" %d", n_doc);
            printf(" %d", n_cur);
            printf(" %d", n_level);
            printf(" %d", n_format);
            printf("\n");
        }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}